

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

char * __thiscall
cmsys::SystemInformationImplementation::GetHostname(SystemInformationImplementation *this)

{
  string *psVar1;
  char *pcVar2;
  int iVar3;
  utsname unameInfo;
  utsname local_19e;
  
  psVar1 = &this->Hostname;
  if ((this->Hostname)._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)0x0,0x56a8a8);
    iVar3 = uname(&local_19e);
    if (iVar3 == 0) {
      pcVar2 = (char *)(this->Hostname)._M_string_length;
      strlen(local_19e.nodename);
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)local_19e.nodename);
    }
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

const char* SystemInformationImplementation::GetHostname()
{
  if (this->Hostname.empty()) {
    this->Hostname = "localhost";
#if defined(_WIN32)
    WORD wVersionRequested;
    WSADATA wsaData;
    char name[255];
    wVersionRequested = MAKEWORD(2, 0);
    if (WSAStartup(wVersionRequested, &wsaData) == 0) {
      gethostname(name, sizeof(name));
      WSACleanup();
    }
    this->Hostname = name;
#else
    struct utsname unameInfo;
    int errorFlag = uname(&unameInfo);
    if (errorFlag == 0) {
      this->Hostname = unameInfo.nodename;
    }
#endif
  }
  return this->Hostname.c_str();
}